

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void event_go_to_exercise_time(tgestate_t *state)

{
  uint8_t *puVar1;
  
  state->bell = '(';
  queue_message(state,message_EXERCISE_TIME);
  state->locked_doors[0] = '\0';
  state->locked_doors[1] = '\x01';
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = '\x0e';
    state->vischars[0].route.step = '\0';
    set_route(state,state->vischars);
  }
  set_prisoners_and_guards_route_B(state,(route_t *)&set_route_go_to_yard_t14);
  return;
}

Assistant:

static void event_go_to_exercise_time(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_EXERCISE_TIME);

  /* Unlock the gates. */
  state->locked_doors[0] = 0; /* Index into doors + clear locked flag. */
  state->locked_doors[1] = 1;

  set_route_go_to_yard(state);
}